

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.cpp
# Opt level: O2

void pstore::index::flush_indices
               (transaction_base *transaction,index_records_array *locations,uint generation)

{
  typed_address<pstore::index::header_block> tVar1;
  int iVar2;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  index;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar2 = 0;
  do {
    switch(iVar2) {
    case 0:
      get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                ::flush(local_40,transaction,generation);
        locations->_M_elems[0].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    case 1:
      get_index<(pstore::trailer::indices)1,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                ::flush((hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                         *)local_40,transaction,generation);
        locations->_M_elems[1].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    case 2:
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                ::flush((hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                         *)local_40,transaction,generation);
        locations->_M_elems[2].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    case 3:
      get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                ::flush((hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                         *)&local_40->internals_container_,transaction,generation);
        locations->_M_elems[3].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    case 4:
      get_index<(pstore::trailer::indices)4,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                ::flush((hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                         *)&local_40->internals_container_,transaction,generation);
        locations->_M_elems[4].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    case 5:
      get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                ((index *)&local_40,transaction->db_,false);
      if (local_40 !=
          (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *)0x0) {
        tVar1 = hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::flush((hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40,transaction,generation);
        locations->_M_elems[5].a_.a_ = (value_type)tVar1.a_.a_;
      }
      break;
    default:
      goto switchD_0012320a_caseD_6;
    case 7:
      return;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
switchD_0012320a_caseD_6:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void flush_indices (transaction_base & transaction,
                            trailer::index_records_array * const locations,
                            unsigned const generation) {
#define X(k)                                                                                       \
    case trailer::indices::k:                                                                      \
        flush_index<trailer::indices::k> (transaction, locations, generation);                     \
        break;

            for (auto ctr = std::underlying_type<trailer::indices>::type{0};
                 ctr <= index_integral (trailer::indices::last); ++ctr) {
                switch (static_cast<trailer::indices> (ctr)) {
                    PSTORE_INDICES
                case trailer::indices::last: break;
                }
            }
#undef X
            PSTORE_ASSERT (locations->size () == index_integral (trailer::indices::last));
        }